

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_error.hpp
# Opt level: O1

string * __thiscall
jsoncons::detail::conv_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,conv_error_category_impl *this,int ev)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(ev) {
  case 1:
    pcVar2 = "Unable to convert into the provided type";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Cannot convert string to UTF-8";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Cannot convert string to wide characters";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Cannot convert to vector";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Cannot convert to std::array";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Cannot convert to map";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Cannot convert to std::pair";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Cannot convert to string";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Cannot convert to string_view";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Cannot convert to byte_string";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Cannot convert to byte_string_view";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Cannot convert to integer";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "Cannot convert to signed integer";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "Cannot convert to unsigned integer";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "Cannot convert to bigint";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "Cannot convert to double";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "Cannot convert to bool";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "Cannot convert to std::variant";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "Cannot convert to std::nullptr_t";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "Cannot convert to jsoncons::null_type";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "Cannot convert to std::bitset";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "Input is not a base64 encoded string";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "Input is not a base64url encoded string";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "Input is not a base16 encoded string";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown conversion error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
        {
            switch (static_cast<conv_errc>(ev))
            {
                case conv_errc::conversion_failed:
                    return "Unable to convert into the provided type";
                case conv_errc::not_utf8:
                    return "Cannot convert string to UTF-8";
                case conv_errc::not_wide_char:
                    return "Cannot convert string to wide characters";
                case conv_errc::not_vector:
                    return "Cannot convert to vector";
                case conv_errc::not_array:
                    return "Cannot convert to std::array";
                case conv_errc::not_map:
                    return "Cannot convert to map";
                case conv_errc::not_pair:
                    return "Cannot convert to std::pair";
                case conv_errc::not_string:
                    return "Cannot convert to string";
                case conv_errc::not_string_view:
                    return "Cannot convert to string_view";
                case conv_errc::not_byte_string:
                    return "Cannot convert to byte_string";
                case conv_errc::not_byte_string_view:
                    return "Cannot convert to byte_string_view";
                case conv_errc::not_integer:
                    return "Cannot convert to integer";
                case conv_errc::not_signed_integer:
                    return "Cannot convert to signed integer";
                case conv_errc::not_unsigned_integer:
                    return "Cannot convert to unsigned integer";
                case conv_errc::not_bigint:
                    return "Cannot convert to bigint";
                case conv_errc::not_double:
                    return "Cannot convert to double";
                case conv_errc::not_bool:
                    return "Cannot convert to bool";
                case conv_errc::not_variant:
                    return "Cannot convert to std::variant";
                case conv_errc::not_nullptr:
                    return "Cannot convert to std::nullptr_t";
                case conv_errc::not_jsoncons_null_type:
                    return "Cannot convert to jsoncons::null_type";
                case conv_errc::not_bitset:
                    return "Cannot convert to std::bitset";
                case conv_errc::not_base64:
                    return "Input is not a base64 encoded string";
                case conv_errc::not_base64url:
                    return "Input is not a base64url encoded string";
                case conv_errc::not_base16:
                    return "Input is not a base16 encoded string";
                default:
                    return "Unknown conversion error";
            }
        }